

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall
module_weight_csv_actions::module_start(module_weight_csv_actions *this,string *module)

{
  ostream *poVar1;
  string *module_local;
  module_weight_csv_actions *this_local;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->weight_);
  poVar1 = std::operator<<(poVar1,(string *)&s_csv_separator_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,(string *)module);
  std::operator<<(poVar1,(string *)&s_csv_separator_abi_cxx11_);
  return;
}

Assistant:

void module_start( std::string const & module )
    {
        std::cout << weight_ << s_csv_separator << module << s_csv_separator;
    }